

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O0

QList<int> * QFontDatabase::smoothSizes(QString *family,QString *styleName)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QPlatformIntegration *pQVar5;
  undefined4 extraout_var;
  ulong uVar6;
  QFontDatabasePrivate *this;
  QtFontFamily *styleString;
  iterator __first;
  iterator __last;
  QMutexLocker<QRecursiveMutex> *in_RDI;
  long in_FS_OFFSET;
  QtFontSize *size;
  int l;
  QtFontStyle *style;
  QtFontFoundry *foundry;
  int j;
  int dpi;
  QtFontFamily *fam;
  QFontDatabasePrivate *d;
  bool smoothScalable;
  int pointSize;
  QList<int> sizes;
  QString foundryName;
  QString familyName;
  Key styleKey;
  QMutexLocker<QRecursiveMutex> locker;
  undefined4 in_stack_ffffffffffffff08;
  parameter_type in_stack_ffffffffffffff0c;
  QMutexLocker<QRecursiveMutex> *this_00;
  QtFontSize *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  QtFontStyle *in_stack_ffffffffffffff40;
  QString *in_stack_ffffffffffffff48;
  FamilyRequestFlags flags;
  QtFontFoundry *this_01;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined4 local_1c;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar5 = QGuiApplicationPrivate::platformIntegration();
  iVar3 = (*pQVar5->_vptr_QPlatformIntegration[0xd])();
  uVar6 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x80))();
  if ((uVar6 & 1) == 0) {
    bVar1 = false;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x743329);
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x743363);
    parseFontName((QString *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                  in_stack_ffffffffffffff48,(QString *)in_stack_ffffffffffffff40);
    flags = (FamilyRequestFlags)((ulong)in_stack_ffffffffffffff48 >> 0x20);
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
    operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
                *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    QMutexLocker<QRecursiveMutex>::QMutexLocker
              (this_00,(QRecursiveMutex *)
                       CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    this = QFontDatabasePrivate::ensureFontDatabase();
    QList<int>::QList((QList<int> *)0x7433fb);
    styleString = QFontDatabasePrivate::family
                            ((QFontDatabasePrivate *)
                             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                             (QString *)
                             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),flags);
    if (styleString == (QtFontFamily *)0x0) {
      QList<int>::QList((QList<int> *)this_00,
                        (QList<int> *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
      ;
    }
    else {
      qt_defaultDpiY();
      local_1c = 0xaaaaaaaa;
      QtFontStyle::Key::Key((Key *)this,(QString *)styleString);
      for (iVar3 = 0; iVar3 < styleString->count; iVar3 = iVar3 + 1) {
        this_01 = styleString->foundries[iVar3];
        bVar2 = QString::isEmpty((QString *)0x7434a4);
        if (((bVar2) ||
            (iVar4 = QString::compare((QString *)this_01,(CaseSensitivity)&local_50), iVar4 == 0))
           && (in_stack_ffffffffffffff40 =
                    QtFontFoundry::style
                              (this_01,&in_stack_ffffffffffffff40->key,
                               (QString *)
                               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                               SUB81((ulong)in_stack_ffffffffffffff30 >> 0x38,0)),
              in_stack_ffffffffffffff40 != (QtFontStyle *)0x0)) {
          if ((*(uint *)&in_stack_ffffffffffffff40->field_0x4 >> 1 & 1) != 0) {
            bVar1 = true;
            break;
          }
          for (in_stack_ffffffffffffff3c = 0;
              in_stack_ffffffffffffff3c < *(int *)&in_stack_ffffffffffffff40->field_0x4 >> 2;
              in_stack_ffffffffffffff3c = in_stack_ffffffffffffff3c + 1) {
            in_stack_ffffffffffffff30 =
                 in_stack_ffffffffffffff40->pixelSizes + in_stack_ffffffffffffff3c;
            if ((*(short *)&in_stack_ffffffffffffff30->field_0x8 != 0) &&
               (*(short *)&in_stack_ffffffffffffff30->field_0x8 != -1)) {
              qRound(3.76274714117766e-317);
              bVar2 = QListSpecialMethodsBase<int>::contains<int>
                                ((QListSpecialMethodsBase<int> *)this_00,
                                 (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08
                                                ));
              if (!bVar2) {
                QList<int>::append((QList<int> *)0x7435c1,in_stack_ffffffffffffff0c);
              }
            }
          }
        }
      }
      if (bVar1) {
        standardSizes();
      }
      else {
        __first = QList<int>::begin((QList<int> *)this_00);
        __last = QList<int>::end((QList<int> *)this_00);
        std::sort<QList<int>::iterator>(__first,__last);
        QList<int>::QList((QList<int> *)this_00,
                          (QList<int> *)
                          CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      }
    }
    QList<int>::~QList((QList<int> *)0x743660);
    QMutexLocker<QRecursiveMutex>::~QMutexLocker(this_00);
    QString::~QString((QString *)0x74367a);
    QString::~QString((QString *)0x743687);
  }
  else {
    standardSizes();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QList<int> *)in_RDI;
}

Assistant:

QList<int> QFontDatabase::smoothSizes(const QString &family,
                                            const QString &styleName)
{
    if (QGuiApplicationPrivate::platformIntegration()->fontDatabase()->fontsAlwaysScalable())
        return standardSizes();

    bool smoothScalable = false;
    QString familyName, foundryName;
    parseFontName(family, foundryName, familyName);

    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    QList<int> sizes;

    QtFontFamily *fam = d->family(familyName);
    if (!fam)
        return sizes;

    const int dpi = qt_defaultDpiY(); // embedded

    QtFontStyle::Key styleKey(styleName);
    for (int j = 0; j < fam->count; j++) {
        QtFontFoundry *foundry = fam->foundries[j];
        if (foundryName.isEmpty() || foundry->name.compare(foundryName, Qt::CaseInsensitive) == 0) {
            QtFontStyle *style = foundry->style(styleKey, styleName);
            if (!style) continue;

            if (style->smoothScalable) {
                smoothScalable = true;
                goto end;
            }
            for (int l = 0; l < style->count; l++) {
                const QtFontSize *size = style->pixelSizes + l;

                if (size->pixelSize != 0 && size->pixelSize != SMOOTH_SCALABLE) {
                    const int pointSize = qRound(size->pixelSize * 72.0 / dpi);
                    if (! sizes.contains(pointSize))
                        sizes.append(pointSize);
                }
            }
        }
    }
 end:
    if (smoothScalable)
        return QFontDatabase::standardSizes();

    std::sort(sizes.begin(), sizes.end());
    return sizes;
}